

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDependence.h
# Opt level: O0

void __thiscall
dg::dda::LLVMDataDependenceAnalysis::LLVMDataDependenceAnalysis
          (LLVMDataDependenceAnalysis *this,Module *m,LLVMPointerAnalysis *pta,
          LLVMDataDependenceAnalysisOptions *opts)

{
  undefined8 uVar1;
  LLVMDataDependenceAnalysisOptions *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  LLVMDataDependenceAnalysisOptions *in_stack_ffffffffffffffc8;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  LLVMDataDependenceAnalysisOptions::LLVMDataDependenceAnalysisOptions
            (in_RCX,in_stack_ffffffffffffffc8);
  uVar1 = dg::dda::LLVMDataDependenceAnalysis::createBuilder();
  in_RDI[0x16] = uVar1;
  std::
  unique_ptr<dg::dda::DataDependenceAnalysis,std::default_delete<dg::dda::DataDependenceAnalysis>>::
  unique_ptr<std::default_delete<dg::dda::DataDependenceAnalysis>,void>
            ((unique_ptr<dg::dda::DataDependenceAnalysis,_std::default_delete<dg::dda::DataDependenceAnalysis>_>
              *)in_RCX,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

LLVMDataDependenceAnalysis(const llvm::Module *m,
                               dg::LLVMPointerAnalysis *pta,
                               LLVMDataDependenceAnalysisOptions opts = {})
            : m(m), pta(pta), _options(std::move(opts)),
              builder(createBuilder()) {}